

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_sdallocx_default(void *ptr,size_t size,int flags)

{
  uint64_t uVar1;
  long lVar2;
  tsd_t *tsd;
  ulong uVar3;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  void **ppvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uintptr_t in_R8;
  cache_bin_t *bin;
  cache_bin_t *cache_bin;
  size_t __n;
  bool bVar8;
  uintptr_t args_raw [3];
  te_ctx_t local_80;
  ulong local_58;
  tcaches_t *local_50;
  void *local_48;
  size_t local_40;
  long local_38;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_0249db70);
  bVar8 = true;
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
    bVar8 = (tsd->state).repr == '\0';
  }
  uVar3 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  if (uVar3 == 0) {
    if (size < 0x1001) {
      __n = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_01c30f6d;
      uVar3 = size * 2 - 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar3 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
      __n = ~uVar3 + size & uVar3;
    }
  }
  else if (uVar3 < 0x1001 && size < 0x3801) {
    uVar5 = -uVar3 & (size + uVar3) - 1;
    if (uVar5 < 0x1001) {
      __n = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar5 + 7 >> 3]];
    }
    else {
      uVar7 = uVar5 * 2 - 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar7 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
      __n = ~uVar7 + uVar5 & uVar7;
    }
    uVar5 = 0x4000;
    if (0x3fff < __n) goto LAB_01c30f72;
  }
  else if (uVar3 < 0x7000000000000001) {
    uVar5 = 0x4000;
    if (0x4000 < size) {
      if (size < 0x7000000000000001) {
        uVar5 = size * 2 - 1;
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar5 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
        uVar5 = ~uVar5 + size & uVar5;
      }
      else {
        uVar5 = 0;
      }
      if (uVar5 < size) goto LAB_01c30f6d;
    }
LAB_01c30f72:
    __n = 0;
    if (uVar5 <= (duckdb_je_sz_large_pad + (uVar3 + 0xfff & 0x7ffffffffffff000) + uVar5) - 0x1000) {
      __n = uVar5;
    }
  }
  else {
LAB_01c30f6d:
    __n = 0;
  }
  uVar6 = flags & 0xfff00;
  if (uVar6 == 0) {
LAB_01c30fb4:
    if (!bVar8) {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
        tcache.tcache = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
      }
      else {
        tcache.tcache = (tcache_t *)0x0;
      }
      goto LAB_01c31146;
    }
    tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
LAB_01c30fc8:
    if (__n < 0x1001) {
      if (tcache.tcache == (tcache_t *)0x0) goto LAB_01c3123b;
      uVar6 = (uint)duckdb_je_sz_size2index_tab[__n + 7 >> 3];
LAB_01c30ff1:
      if (uVar6 < 0x24) {
        cache_bin = (tcache.tcache)->bins + uVar6;
        ppvVar4 = cache_bin->stack_head;
        if (cache_bin->low_bits_full == (uint16_t)ppvVar4) {
          if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
            duckdb_je_tcache_bin_flush_small
                      (tsd,tcache.tcache,cache_bin,uVar6,
                       (uint)((cache_bin->bin_info).ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c312dd:
            ppvVar4 = cache_bin->stack_head;
            if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
              cache_bin->stack_head = ppvVar4 + -1;
              ppvVar4[-1] = ptr;
            }
            goto LAB_01c31027;
          }
          goto LAB_01c31415;
        }
        goto LAB_01c3101b;
      }
      if (uVar6 < (tcache.tcache)->tcache_slow->tcache_nbins) {
        ppvVar4 = (tcache.tcache)->bins[uVar6].stack_head;
        if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
          cache_bin = (tcache.tcache)->bins + uVar6;
          if (cache_bin->low_bits_full == (uint16_t)ppvVar4) {
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,cache_bin,uVar6,
                       (uint)((cache_bin->bin_info).ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01c312dd;
          }
          goto LAB_01c3101b;
        }
      }
      goto LAB_01c31313;
    }
    if (tcache.tcache != (tcache_t *)0x0) {
      uVar6 = sz_size2index_compute(__n);
      goto LAB_01c30ff1;
    }
  }
  else {
    if ((uVar6 == 0x100) || (uVar6 >> 8 == 1)) {
      tcache.tcache = (tcache_t *)0x0;
    }
    else {
      if (uVar6 == 0) goto LAB_01c30fb4;
      local_58 = (ulong)((uVar6 >> 8) - 2);
      local_50 = duckdb_je_tcaches;
      tcache = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[local_58].field_0.tcache;
      if (tcache.tcache == (tcache_t *)0x0) {
        duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
        abort();
      }
      if (tcache.tcache == (tcache_t *)&DAT_00000001) {
        tcache.tcache = duckdb_je_tcache_create_explicit(tsd);
        local_50[local_58].field_0 = tcache;
      }
    }
    if (bVar8) goto LAB_01c30fc8;
LAB_01c31146:
    local_38 = (long)flags;
    local_48 = ptr;
    local_40 = size;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_sdallocx,ptr,(uintptr_t *)&local_48);
    if (duckdb_je_opt_junk_free == true) {
      switchD_010444a0::default(ptr,0x5a,__n);
    }
    if (tcache.tcache != (tcache_t *)0x0) {
      if (__n < 0x1001) {
        uVar6 = (uint)duckdb_je_sz_size2index_tab[__n + 7 >> 3];
      }
      else {
        uVar6 = sz_size2index_compute(__n);
      }
      if (uVar6 < 0x24) {
        cache_bin = (tcache.tcache)->bins + uVar6;
        ppvVar4 = cache_bin->stack_head;
        if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
LAB_01c3101b:
          cache_bin->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
          goto LAB_01c31027;
        }
        if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
LAB_01c31415:
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
          goto LAB_01c31027;
        }
        duckdb_je_tcache_bin_flush_small
                  (tsd,tcache.tcache,cache_bin,uVar6,
                   (uint)((cache_bin->bin_info).ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c31204:
        ppvVar4 = cache_bin->stack_head;
        if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
          cache_bin->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
        }
      }
      else {
        if (uVar6 < (tcache.tcache)->tcache_slow->tcache_nbins) {
          ppvVar4 = (tcache.tcache)->bins[uVar6].stack_head;
          if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
            cache_bin = (tcache.tcache)->bins + uVar6;
            if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
              cache_bin->stack_head = ppvVar4 + -1;
              ppvVar4[-1] = ptr;
              goto LAB_01c31027;
            }
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,cache_bin,uVar6,
                       (uint)((cache_bin->bin_info).ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01c31204;
          }
        }
LAB_01c31313:
        rtree_read((rtree_contents_t *)&local_80,(tsdn_t *)tsd,
                   (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                   (rtree_ctx_t *)ptr,in_R8);
        duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_80._1_7_,local_80.is_alloc));
      }
      goto LAB_01c31027;
    }
  }
LAB_01c3123b:
  arena_sdalloc_no_tcache((tsdn_t *)tsd,ptr,__n);
LAB_01c31027:
  local_80.is_alloc = false;
  local_80.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_80.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_80.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_80.next_event_fast =
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar1 + __n;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      uVar1 <= __n) {
    duckdb_je_te_event_trigger(tsd,&local_80);
  }
  return;
}

Assistant:

JEMALLOC_NOINLINE void
sdallocx_default(void *ptr, size_t size, int flags) {
	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	size_t usize = inallocx(tsd_tsdn(tsd), size, flags);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		isfree(tsd, ptr, usize, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, size, flags};
		hook_invoke_dalloc(hook_dalloc_sdallocx, ptr, args_raw);
		isfree(tsd, ptr, usize, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));
}